

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbmain.cpp
# Opt level: O3

QPlatformIntegration * __thiscall
QXcbIntegrationPlugin::create
          (QXcbIntegrationPlugin *this,QString *system,QStringList *parameters,int *argc,char **argv
          )

{
  int iVar1;
  QXcbIntegration *this_00;
  QLatin1String QVar2;
  
  this_00 = (QXcbIntegration *)0x0;
  QVar2.m_data = (char *)0x3;
  QVar2.m_size = (qsizetype)system;
  iVar1 = QString::compare(QVar2,0x103000);
  if (iVar1 == 0) {
    this_00 = (QXcbIntegration *)operator_new(0x70);
    QXcbIntegration::QXcbIntegration(this_00,(QList *)parameters,argc,argv);
    if (*(long *)(this_00 + 0x18) == 0) {
      (**(code **)(*(long *)this_00 + 8))(this_00);
      this_00 = (QXcbIntegration *)0x0;
    }
  }
  return (QPlatformIntegration *)this_00;
}

Assistant:

QPlatformIntegration* QXcbIntegrationPlugin::create(const QString& system, const QStringList& parameters, int &argc, char **argv)
{
    if (!system.compare("xcb"_L1, Qt::CaseInsensitive)) {
        auto xcbIntegration = new QXcbIntegration(parameters, argc, argv);
        if (!xcbIntegration->hasConnection()) {
            delete xcbIntegration;
            return nullptr;
        }
        return xcbIntegration;
    }

    return nullptr;
}